

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall Polymer::CheckAheadRnase(Polymer *this,int old_stop,int new_stop)

{
  element_type *peVar1;
  pointer pIVar2;
  int iVar3;
  SpeciesTracker *this_00;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  *__range1;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  pointer pIVar4;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  intervalVector local_48;
  
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)(old_stop + 1),(long)new_stop,&local_48);
  pIVar2 = local_48.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar4 = local_48.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar4 != pIVar2; pIVar4 = pIVar4 + 1) {
    peVar1 = (pIVar4->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar1->super_FixedElement).start_ < new_stop) {
      iVar3 = (peVar1->super_FixedElement).covered_;
      (peVar1->super_FixedElement).covered_ = iVar3 + 1;
      if (-1 < iVar3 && (peVar1->super_FixedElement).old_covered_ == 0) {
        LogCover(this,&(peVar1->super_FixedElement).name_);
      }
      iVar3 = std::__cxx11::string::compare
                        ((char *)&(((pIVar4->value).
                                    super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->super_FixedElement).gene_);
      if (((iVar3 != 0) &&
          (peVar1 = (pIVar4->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr, (peVar1->super_FixedElement).first_exposure_ == true)) &&
         ((peVar1->super_FixedElement).field_0x9d == '\0')) {
        this->degraded_elements_ = this->degraded_elements_ + 1;
        this_00 = SpeciesTracker::Instance();
        SpeciesTracker::IncrementTranscript
                  (this_00,&(((pIVar4->value).
                              super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            super_FixedElement).gene_,-1);
      }
      BindingSite::Degrade
                ((pIVar4->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ;
      peVar1 = (pIVar4->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (peVar1->super_FixedElement).old_covered_ = (peVar1->super_FixedElement).covered_;
    }
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Polymer::CheckAheadRnase(int old_stop, int new_stop) {
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(old_stop + 1, new_stop, results);
  for (auto &interval : results) {
    if (interval.value->start() < new_stop) {
      interval.value->Cover();
      if (interval.value->WasCovered()) {
        // Record changes that species was covered
        LogCover(interval.value->name());
      }
      if (interval.value->gene() != "" &&
          interval.value->first_exposure() == true &&
          interval.value->degraded() == false) {
        degraded_elements_ += 1;
        SpeciesTracker::Instance().IncrementTranscript(interval.value->gene(),
                                                       -1);
      }
      interval.value->Degrade();
      interval.value->ResetState();
    }
  }
}